

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QSet<QGesture_*> * __thiscall
QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
          (QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *this,QGraphicsObject **key)

{
  QSet<QGesture_*> *pQVar1;
  long in_FS_OFFSET;
  QGraphicsObject **in_stack_ffffffffffffffb8;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pQVar1 = iterator::operator*((iterator *)0x9e1123);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }